

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangle_fekete_rule.cpp
# Opt level: O0

void fekete_rule(int rule,int param_2,double *xy,double *w)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  int suborder_num_00;
  int iVar3;
  ulong uVar4;
  double *suborder_xyz_00;
  double *suborder_w_00;
  int *piVar5;
  ostream *poVar6;
  double *suborder_xyz;
  double *suborder_w;
  int suborder_num;
  int *suborder;
  int local_28;
  int s;
  int o;
  int k;
  double *w_local;
  double *xy_local;
  int param_1_local;
  int rule_local;
  
  suborder_num_00 = fekete_suborder_num(rule);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)(suborder_num_00 * 3);
  uVar4 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar4 = 0xffffffffffffffff;
  }
  suborder_xyz_00 = (double *)operator_new__(uVar4);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)suborder_num_00;
  uVar4 = SUB168(auVar2 * ZEXT816(8),0);
  if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
    uVar4 = 0xffffffffffffffff;
  }
  suborder_w_00 = (double *)operator_new__(uVar4);
  piVar5 = fekete_suborder(rule,suborder_num_00);
  fekete_subrule(rule,suborder_num_00,suborder_xyz_00,suborder_w_00);
  local_28 = 0;
  suborder._4_4_ = 0;
  do {
    if (suborder_num_00 <= suborder._4_4_) {
      if (piVar5 != (int *)0x0) {
        operator_delete__(piVar5);
      }
      if (suborder_xyz_00 != (double *)0x0) {
        operator_delete__(suborder_xyz_00);
      }
      if (suborder_w_00 != (double *)0x0) {
        operator_delete__(suborder_w_00);
      }
      return;
    }
    if (piVar5[suborder._4_4_] == 1) {
      xy[local_28 << 1] = suborder_xyz_00[suborder._4_4_ * 3];
      xy[local_28 * 2 + 1] = suborder_xyz_00[suborder._4_4_ * 3 + 1];
      w[local_28] = suborder_w_00[suborder._4_4_];
      local_28 = local_28 + 1;
    }
    else if (piVar5[suborder._4_4_] == 3) {
      for (s = 0; s < 3; s = s + 1) {
        iVar3 = i4_wrap(s,0,2);
        xy[local_28 << 1] = suborder_xyz_00[iVar3 + suborder._4_4_ * 3];
        iVar3 = i4_wrap(s + 1,0,2);
        xy[local_28 * 2 + 1] = suborder_xyz_00[iVar3 + suborder._4_4_ * 3];
        w[local_28] = suborder_w_00[suborder._4_4_];
        local_28 = local_28 + 1;
      }
    }
    else {
      if (piVar5[suborder._4_4_] != 6) {
        std::operator<<((ostream *)&std::cerr,"\n");
        std::operator<<((ostream *)&std::cerr,"FEKETE_RULE - Fatal error!\n;");
        poVar6 = std::operator<<((ostream *)&std::cerr,"  Illegal SUBORDER(");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,suborder._4_4_);
        poVar6 = std::operator<<(poVar6,") = ");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,piVar5[suborder._4_4_]);
        std::operator<<(poVar6,"\n");
        exit(1);
      }
      for (s = 0; s < 3; s = s + 1) {
        iVar3 = i4_wrap(s,0,2);
        xy[local_28 << 1] = suborder_xyz_00[iVar3 + suborder._4_4_ * 3];
        iVar3 = i4_wrap(s + 1,0,2);
        xy[local_28 * 2 + 1] = suborder_xyz_00[iVar3 + suborder._4_4_ * 3];
        w[local_28] = suborder_w_00[suborder._4_4_];
        local_28 = local_28 + 1;
      }
      for (s = 0; s < 3; s = s + 1) {
        iVar3 = i4_wrap(s + 1,0,2);
        xy[local_28 << 1] = suborder_xyz_00[iVar3 + suborder._4_4_ * 3];
        iVar3 = i4_wrap(s,0,2);
        xy[local_28 * 2 + 1] = suborder_xyz_00[iVar3 + suborder._4_4_ * 3];
        w[local_28] = suborder_w_00[suborder._4_4_];
        local_28 = local_28 + 1;
      }
    }
    suborder._4_4_ = suborder._4_4_ + 1;
  } while( true );
}

Assistant:

void fekete_rule ( int rule, int /*order_num*/, double xy[], double w[] )

//****************************************************************************80
//
//  Purpose:
//
//    FEKETE_RULE returns the points and weights of a Fekete rule.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    30 January 2007
//
//  Author:
//
//    John Burkardt
//
//  Reference:
//
//    Mark Taylor, Beth Wingate, Rachel Vincent,
//    An Algorithm for Computing Fekete Points in the Triangle,
//    SIAM Journal on Numerical Analysis,
//    Volume 38, Number 5, 2000, pages 1707-1720.
//
//  Parameters:
//
//    Input, int RULE, the index of the rule.
//
//    Input, int ORDER_NUM, the order (number of points) of the rule.
//
//    Output, double XY[2*ORDER_NUM], the points of the rule.
//
//    Output, double W[ORDER_NUM], the weights of the rule.
//
{
  int k;
  int o;
  int s;
  int *suborder;
  int suborder_num;
  double *suborder_w;
  double *suborder_xyz;
//
//  Get the suborder information.
//
  suborder_num = fekete_suborder_num ( rule );

  suborder_xyz = new double[3*suborder_num];
  suborder_w = new double[suborder_num];

  suborder = fekete_suborder ( rule, suborder_num );

  fekete_subrule ( rule, suborder_num, suborder_xyz, suborder_w );
//
//  Expand the suborder information to a full order rule.
//
  o = 0;

  for ( s = 0; s < suborder_num; s++ )
  {
    if ( suborder[s] == 1 )
    {
      xy[0+o*2] = suborder_xyz[0+s*3];
      xy[1+o*2] = suborder_xyz[1+s*3];
      w[o] = suborder_w[s];
      o = o + 1;
    }
    else if ( suborder[s] == 3 )
    {
      for ( k = 0; k < 3; k++ )
      {
        xy[0+o*2] = suborder_xyz [ i4_wrap(k,  0,2) + s*3 ];
        xy[1+o*2] = suborder_xyz [ i4_wrap(k+1,0,2) + s*3 ];
        w[o] = suborder_w[s];
        o = o + 1;
      }
    }
    else if ( suborder[s] == 6 )
    {
      for ( k = 0; k < 3; k++ )
      {
        xy[0+o*2] = suborder_xyz [ i4_wrap(k,  0,2) + s*3 ];
        xy[1+o*2] = suborder_xyz [ i4_wrap(k+1,0,2) + s*3 ];
        w[o] = suborder_w[s];
        o = o + 1;
      }

      for ( k = 0; k < 3; k++ )
      {
        xy[0+o*2] = suborder_xyz [ i4_wrap(k+1,0,2) + s*3 ];
        xy[1+o*2] = suborder_xyz [ i4_wrap(k,  0,2) + s*3 ];
        w[o] = suborder_w[s];
        o = o + 1;
      }
    }
    else
    {
      std::cerr << "\n";
      std::cerr << "FEKETE_RULE - Fatal error!\n;";
      std::cerr << "  Illegal SUBORDER(" << s << ") = " << suborder[s] << "\n";
      exit ( 1 );
    }
  }

  delete [] suborder;
  delete [] suborder_xyz;
  delete [] suborder_w;

  return;
}